

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

HelicsTranslator
helicsCoreRegisterTranslator(HelicsCore cr,HelicsTranslatorTypes type,char *name,HelicsError *err)

{
  bool bVar1;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *trans_00;
  pointer this;
  pointer pTVar2;
  long in_RDX;
  int in_ESI;
  __single_object trans;
  shared_ptr<helics::Core> core;
  undefined4 in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff3c;
  Translator *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *this_00;
  HelicsCore in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  Core **in_stack_ffffffffffffff78;
  HelicsCore in_stack_ffffffffffffffa0;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> local_48;
  undefined4 local_3c;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_38;
  long local_20;
  int local_14;
  HelicsTranslator local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  getCoreSharedPtr(in_stack_ffffffffffffff58,(HelicsError *)in_stack_ffffffffffffff50);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
  if (bVar1) {
    std::make_unique<helics::TranslatorObject>();
    trans_00 = (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(&local_38);
    if (local_20 == 0) {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff40);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff50,
                 (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    std::
    make_unique<helics::Translator,helics::Core*,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)0x1eb95e);
    std::unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_>::operator=
              ((unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_> *)
               in_stack_ffffffffffffff40,
               (unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_>::~unique_ptr
              ((unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_> *)
               in_stack_ffffffffffffff50);
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)0x1eb988);
    std::unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_>::operator->
              ((unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_> *)0x1eb994)
    ;
    helics::Translator::setTranslatorType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    this_00 = &local_48;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)0x1eb9b7);
    this = std::unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_>::get
                     ((unique_ptr<helics::Translator,_std::default_delete<helics::Translator>_> *)
                      in_stack_ffffffffffffff40);
    pTVar2 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1eb9d2);
    pTVar2->transPtr = this;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)0x1eb9e5);
    std::shared_ptr<helics::Core>::operator=
              ((shared_ptr<helics::Core> *)this,
               (shared_ptr<helics::Core> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pTVar2 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1eba0e);
    pTVar2->custom = local_14 == 0;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)this,(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                        *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_8 = coreAddTranslator(in_stack_ffffffffffffffa0,trans_00);
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr(this_00);
    local_3c = 1;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr(this_00);
  }
  else {
    local_8 = (HelicsTranslator)0x0;
    local_3c = 1;
  }
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x1ebb2a);
  return local_8;
}

Assistant:

HelicsTranslator helicsCoreRegisterTranslator(HelicsCore cr, HelicsTranslatorTypes type, const char* name, HelicsError* err)
{
    auto core = getCoreSharedPtr(cr, err);
    if (!core) {
        return nullptr;
    }
    try {
        auto trans = std::make_unique<helics::TranslatorObject>();

        trans->mTrans = std::make_unique<helics::Translator>(core.get(), AS_STRING_VIEW(name));
        trans->mTrans->setTranslatorType(type);
        trans->transPtr = trans->mTrans.get();
        trans->corePtr = std::move(core);
        trans->custom = (type == HELICS_TRANSLATOR_TYPE_CUSTOM);
        return coreAddTranslator(cr, std::move(trans));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}